

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-affinity.c
# Opt level: O3

int run_test_thread_affinity(void)

{
  int *piVar1;
  uv_buf_t *puVar2;
  char *arg;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  char *cpumask;
  uv_thread_t uVar5;
  void *pvVar6;
  uv_thread_t *extraout_RAX;
  long *extraout_RAX_00;
  pthread_t __th;
  ulong uVar7;
  addrinfo *ai;
  size_t sVar8;
  code *pcVar9;
  uv_thread_t *puVar10;
  uv_loop_t *puVar11;
  uv_thread_t *puVar12;
  long *plVar13;
  undefined1 *puVar14;
  uv_fs_t *req;
  char *unaff_R14;
  long lVar15;
  ulong unaff_R15;
  bool bVar16;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t threads [3];
  undefined1 auStack_1098 [104];
  Elf64_Ehdr *pEStack_1030;
  uv_loop_t *puStack_1028;
  size_t sStack_1020;
  rlim64_t rStack_1018;
  size_t sStack_1010;
  rlimit64 rStack_1008;
  pthread_attr_t pStack_ff8;
  code *pcStack_fc0;
  long *plStack_fb8;
  undefined1 auStack_fb0 [8];
  uv_thread_t uStack_fa8;
  uv_thread_t *puStack_fa0;
  uv_thread_t *puStack_f98;
  code *pcStack_f90;
  long alStack_f80 [2];
  undefined4 uStack_f70;
  undefined1 uStack_f6c;
  uv_thread_t uStack_f68;
  uv_thread_t auStack_f60 [2];
  uv_thread_t *puStack_f50;
  uv_loop_t *puStack_f48;
  _func_void_uv__work_ptr *p_Stack_f40;
  _func_void_uv__work_ptr_int *p_Stack_f38;
  getaddrinfo_req agStack_f30 [4];
  uv_loop_t uStack_c48;
  fs_req afStack_920 [4];
  code *pcStack_1c0;
  long lStack_1b8;
  code *pcStack_1b0;
  long lStack_1a8;
  uv_thread_t uStack_1a0;
  uv_thread_t uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  uv_thread_t *puStack_110;
  code *pcStack_108;
  code *pcStack_100;
  long lStack_f8;
  long lStack_f0;
  code *apcStack_e8 [2];
  undefined8 uStack_d8;
  long lStack_d0;
  uv_thread_t uStack_c8;
  code *pcStack_c0;
  uv_thread_t auStack_b8 [4];
  uv_thread_t *puStack_98;
  long lStack_90;
  undefined8 uStack_88;
  size_t sStack_80;
  size_t sStack_78;
  code *pcStack_70;
  long local_68;
  uv_thread_t local_60;
  uv_thread_t local_58;
  uv_thread_t local_50;
  uv_thread_t local_48 [2];
  ulong local_38;
  
  pcStack_70 = (code *)0x1ce893;
  local_58 = uv_thread_self();
  pcStack_70 = (code *)0x1ce89d;
  uVar3 = uv_cpumask_size();
  sVar8 = (size_t)(int)uVar3;
  local_68 = 0;
  cpumask = unaff_R14;
  local_60 = sVar8;
  if ((long)sVar8 < 1) {
LAB_001cec38:
    pcStack_70 = (code *)0x1cec45;
    run_test_thread_affinity_cold_1();
    unaff_R14 = cpumask;
LAB_001cec45:
    cpumask = unaff_R14;
    pcStack_70 = (code *)0x1cec4a;
    run_test_thread_affinity_cold_21();
LAB_001cec4a:
    pcStack_70 = (code *)0x1cec57;
    run_test_thread_affinity_cold_2();
LAB_001cec57:
    pcStack_70 = (code *)0x1cec5c;
    run_test_thread_affinity_cold_20();
LAB_001cec5c:
    pcStack_70 = (code *)0x1cec69;
    run_test_thread_affinity_cold_3();
LAB_001cec69:
    pcStack_70 = (code *)0x1cec76;
    run_test_thread_affinity_cold_4();
LAB_001cec76:
    pcStack_70 = (code *)0x1cec83;
    run_test_thread_affinity_cold_5();
LAB_001cec83:
    pcStack_70 = (code *)0x1cec90;
    run_test_thread_affinity_cold_6();
LAB_001cec90:
    pcStack_70 = (code *)0x1cec95;
    run_test_thread_affinity_cold_7();
LAB_001cec95:
    pcStack_70 = (code *)0x1cec9a;
    run_test_thread_affinity_cold_8();
LAB_001cec9a:
    pcStack_70 = (code *)0x1ceca7;
    run_test_thread_affinity_cold_9();
LAB_001ceca7:
    pcStack_70 = (code *)0x1cecac;
    run_test_thread_affinity_cold_10();
LAB_001cecac:
    pcStack_70 = (code *)0x1cecb9;
    run_test_thread_affinity_cold_11();
LAB_001cecb9:
    pcStack_70 = (code *)0x1cecc6;
    run_test_thread_affinity_cold_12();
LAB_001cecc6:
    pcStack_70 = (code *)0x1ceccb;
    run_test_thread_affinity_cold_13();
LAB_001ceccb:
    pcStack_70 = (code *)0x1cecd8;
    run_test_thread_affinity_cold_14();
LAB_001cecd8:
    pcStack_70 = (code *)0x1cece5;
    run_test_thread_affinity_cold_19();
LAB_001cece5:
    pcStack_70 = (code *)0x1cecf2;
    run_test_thread_affinity_cold_15();
  }
  else {
    pcStack_70 = (code *)0x1ce8d7;
    cpumask = (char *)calloc((long)(int)(uVar3 * 4),1);
    if (cpumask == (char *)0x0) goto LAB_001cec45;
    pcStack_70 = (code *)0x1ce8f3;
    iVar4 = uv_thread_getaffinity(&local_58,cpumask,sVar8);
    local_60 = (uv_thread_t)iVar4;
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cec4a;
    if (*cpumask == '\0') goto LAB_001cec57;
    unaff_R15 = 0xffffffffffffffff;
    do {
      lVar15 = unaff_R15 + 2;
      unaff_R15 = unaff_R15 + 1;
    } while (cpumask[lVar15] != '\0');
    pcStack_70 = (code *)0x1ce940;
    local_38 = (ulong)uVar3;
    memset(cpumask,0,(long)(int)(uVar3 * 4));
    cpumask[sVar8] = '\x01';
    cpumask[sVar8 * 2] = '\x01';
    bVar16 = unaff_R15 != 0;
    cpumask[bVar16] = '\x01';
    cpumask[(int)((int)(sVar8 * 3) + (uint)bVar16)] = '\x01';
    cpumask[sVar8 + 2] = '\x01';
    cpumask[sVar8 * 2 + 2] = '\x01';
    cpumask[3] = '\x01';
    cpumask[sVar8 * 3 + 3] = '\x01';
    pcStack_70 = (code *)0x1ce98e;
    iVar4 = uv_thread_create(&local_50,check_affinity,cpumask);
    local_60 = (uv_thread_t)iVar4;
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cec5c;
    arg = cpumask + sVar8 * 2;
    pcStack_70 = (code *)0x1ce9c7;
    iVar4 = uv_thread_create(local_48,check_affinity,arg);
    local_60 = (uv_thread_t)iVar4;
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cec69;
    pcStack_70 = (code *)0x1ce9ef;
    iVar4 = uv_thread_join(&local_50);
    local_60 = (uv_thread_t)iVar4;
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cec76;
    pcStack_70 = (code *)0x1cea15;
    iVar4 = uv_thread_join(local_48);
    local_60 = (uv_thread_t)iVar4;
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cec83;
    if ((int)*cpumask != (uint)(unaff_R15 == 0)) goto LAB_001cec90;
    if ((int)cpumask[1] != (uint)bVar16) goto LAB_001cec95;
    local_60 = (uv_thread_t)cpumask[2];
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cec9a;
    if ((int)cpumask[3] != (uint)(2 < unaff_R15)) goto LAB_001ceca7;
    local_60 = 1;
    local_68 = (long)*arg;
    if (local_68 != 1) goto LAB_001cecac;
    local_60 = (uv_thread_t)cpumask[(long)(int)(uVar3 * 2) + 1];
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cecb9;
    if ((int)arg[2] != (uint)(1 < unaff_R15)) goto LAB_001cecc6;
    local_60 = (uv_thread_t)arg[3];
    local_68 = 0;
    if (local_60 != 0) goto LAB_001ceccb;
    pcStack_70 = (code *)0x1ceb13;
    uVar3 = uv_thread_getcpu();
    unaff_R15 = (ulong)(int)uVar3;
    local_68 = 0;
    local_60 = unaff_R15;
    if ((long)unaff_R15 < 0) goto LAB_001cecd8;
    pcStack_70 = (code *)0x1ceb41;
    memset(cpumask,0,sVar8);
    cpumask[unaff_R15] = '\x01';
    pcStack_70 = (code *)0x1ceb58;
    iVar4 = uv_thread_setaffinity(&local_58,cpumask,(char *)0x0,sVar8);
    local_60 = (uv_thread_t)iVar4;
    local_68 = 0;
    if (local_60 != 0) goto LAB_001cece5;
    pcStack_70 = (code *)0x1ceb83;
    memset(cpumask,0,sVar8);
    pcStack_70 = (code *)0x1ceb93;
    iVar4 = uv_thread_getaffinity(&local_58,cpumask,sVar8);
    local_60 = (uv_thread_t)iVar4;
    local_68 = 0;
    if (local_60 == 0) {
      local_60 = 0;
      if (0 < (int)local_38) {
        uVar7 = 0;
        do {
          if (uVar3 != uVar7) {
            local_60 = (uv_thread_t)cpumask[uVar7];
            local_68 = 0;
            if (local_60 == 0) goto LAB_001cebfd;
LAB_001cec2b:
            pcStack_70 = (code *)0x1cec38;
            run_test_thread_affinity_cold_17();
            goto LAB_001cec38;
          }
          local_60 = 1;
          local_68 = (long)cpumask[uVar3];
          if (local_68 != 1) {
            pcStack_70 = (code *)0x1cec2b;
            run_test_thread_affinity_cold_18();
            goto LAB_001cec2b;
          }
LAB_001cebfd:
          uVar7 = uVar7 + 1;
        } while (sVar8 != uVar7);
      }
      pcStack_70 = (code *)0x1cec0d;
      free(cpumask);
      return 0;
    }
  }
  puVar10 = &local_60;
  pcStack_70 = check_affinity;
  run_test_thread_affinity_cold_16();
  puStack_98 = (uv_thread_t *)0x1ced0e;
  sStack_78 = sVar8;
  pcStack_70 = (code *)cpumask;
  iVar4 = uv_cpumask_size();
  sVar8 = (size_t)iVar4;
  lStack_90 = 0;
  sStack_80 = sVar8;
  if ((long)sVar8 < 1) {
    puStack_98 = (uv_thread_t *)0x1ceda0;
    check_affinity_cold_1();
LAB_001ceda0:
    puStack_98 = (uv_thread_t *)0x1cedad;
    check_affinity_cold_2();
  }
  else {
    puStack_98 = (uv_thread_t *)0x1ced2e;
    sStack_80 = uv_thread_self();
    puStack_98 = (uv_thread_t *)0x1ced43;
    iVar4 = uv_thread_setaffinity(&sStack_80,(char *)puVar10,(char *)0x0,sVar8);
    lStack_90 = (long)iVar4;
    uStack_88 = 0;
    if (lStack_90 != 0) goto LAB_001ceda0;
    puStack_98 = (uv_thread_t *)0x1ced71;
    iVar4 = uv_thread_setaffinity(&sStack_80,(char *)((long)puVar10 + sVar8),(char *)puVar10,sVar8);
    lStack_90 = (long)iVar4;
    uStack_88 = 0;
    if (lStack_90 == 0) {
      return iVar4;
    }
  }
  puStack_98 = (uv_thread_t *)0x1cedba;
  check_affinity_cold_3();
  puVar12 = auStack_b8;
  pcStack_c0 = (code *)0x1cedc6;
  puStack_98 = puVar10;
  main_thread_id = uv_thread_self();
  auStack_b8[2] = 0;
  pcStack_c0 = (code *)0x1cede5;
  iVar4 = uv_thread_equal(&main_thread_id,&main_thread_id);
  auStack_b8[0] = (uv_thread_t)iVar4;
  if (auStack_b8[2] == auStack_b8[0]) {
    pcStack_c0 = (code *)0x1ceef1;
    run_test_thread_equal_cold_6();
LAB_001ceef1:
    pcStack_c0 = (code *)0x1ceefe;
    run_test_thread_equal_cold_1();
LAB_001ceefe:
    pcStack_c0 = (code *)0x1cef0b;
    run_test_thread_equal_cold_2();
LAB_001cef0b:
    pcStack_c0 = (code *)0x1cef18;
    run_test_thread_equal_cold_3();
LAB_001cef18:
    pcStack_c0 = (code *)0x1cef25;
    run_test_thread_equal_cold_4();
  }
  else {
    pcStack_c0 = (code *)0x1cee12;
    iVar4 = uv_thread_create(auStack_b8 + 2,check_thread,subthreads);
    auStack_b8[0] = (uv_thread_t)iVar4;
    auStack_b8[1] = 0;
    if (auStack_b8[0] != 0) goto LAB_001ceef1;
    puVar10 = auStack_b8 + 3;
    pcStack_c0 = (code *)0x1cee4b;
    iVar4 = uv_thread_create(puVar10,check_thread,subthreads + 1);
    auStack_b8[0] = (uv_thread_t)iVar4;
    auStack_b8[1] = 0;
    if (auStack_b8[0] != 0) goto LAB_001ceefe;
    pcStack_c0 = (code *)0x1cee73;
    iVar4 = uv_thread_join(auStack_b8 + 2);
    auStack_b8[0] = (uv_thread_t)iVar4;
    auStack_b8[1] = 0;
    if (auStack_b8[0] != 0) goto LAB_001cef0b;
    pcStack_c0 = (code *)0x1cee95;
    iVar4 = uv_thread_join(puVar10);
    auStack_b8[0] = (uv_thread_t)iVar4;
    auStack_b8[1] = 0;
    if (auStack_b8[0] != 0) goto LAB_001cef18;
    pcStack_c0 = (code *)0x1ceec2;
    iVar4 = uv_thread_equal(subthreads,subthreads + 1);
    auStack_b8[0] = (uv_thread_t)iVar4;
    auStack_b8[1] = 0;
    if (auStack_b8[0] == 0) {
      return 0;
    }
  }
  pcStack_c0 = check_thread;
  run_test_thread_equal_cold_5();
  apcStack_e8[0] = (code *)0x1cef3f;
  pcStack_c0 = (code *)puVar10;
  uStack_c8 = uv_thread_self();
  apcStack_e8[0] = (code *)0x1cef53;
  iVar4 = uv_thread_equal(&main_thread_id,&uStack_c8);
  lStack_d0 = (long)iVar4;
  uStack_d8 = 0;
  if (lStack_d0 == 0) {
    apcStack_e8[0] = (code *)0x1cef74;
    uVar5 = uv_thread_self();
    *puVar12 = uVar5;
    return (int)uVar5;
  }
  apcStack_e8[0] = run_test_thread_create;
  check_thread_cold_1();
  pcStack_100 = (code *)0x1cefa6;
  iVar4 = uv_thread_create((uv_thread_t *)apcStack_e8,thread_entry,(void *)0x2a);
  lStack_f0 = (long)iVar4;
  lStack_f8 = 0;
  if (lStack_f0 == 0) {
    pcStack_100 = (code *)0x1cefca;
    iVar4 = uv_thread_join((uv_thread_t *)apcStack_e8);
    lStack_f0 = (long)iVar4;
    lStack_f8 = 0;
    if (lStack_f0 != 0) goto LAB_001cf017;
    lStack_f0 = 1;
    lStack_f8 = (long)thread_called;
    if (lStack_f8 == 1) {
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x1cf017;
    run_test_thread_create_cold_1();
LAB_001cf017:
    pcStack_100 = (code *)0x1cf024;
    run_test_thread_create_cold_2();
  }
  plVar13 = &lStack_f0;
  pcStack_100 = thread_entry;
  run_test_thread_create_cold_3();
  if (plVar13 == (long *)0x2a) {
    thread_called = thread_called + 1;
    return extraout_EAX;
  }
  pcStack_108 = run_test_threadpool_multiple_event_loops;
  thread_entry_cold_1();
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  lVar15 = 0;
  pcVar9 = do_work;
  puStack_110 = puVar12;
  pcStack_108 = (code *)sVar8;
  do {
    pcStack_1b0 = (code *)0x1cf099;
    iVar4 = uv_thread_create((uv_thread_t *)((long)&uStack_198 + lVar15),do_work,
                             (uv_thread_t *)((long)&uStack_198 + lVar15));
    uStack_1a0 = (uv_thread_t)iVar4;
    lStack_1a8 = 0;
    if (uStack_1a0 != 0) {
      pcStack_1b0 = (code *)0x1cf12d;
      run_test_threadpool_multiple_event_loops_cold_1();
      goto LAB_001cf12d;
    }
    lVar15 = lVar15 + 0x10;
    uStack_1a0 = 0;
  } while (lVar15 != 0x80);
  pcVar9 = (code *)0x0;
  uStack_1a0 = 0;
  while( true ) {
    pcStack_1b0 = (code *)0x1cf0cf;
    iVar4 = uv_thread_join((uv_thread_t *)(pcVar9 + (long)&uStack_198));
    uStack_1a0 = (uv_thread_t)iVar4;
    lStack_1a8 = 0;
    if (uStack_1a0 != 0) break;
    uStack_1a0 = 1;
    lStack_1a8 = (long)*(int *)((long)&uStack_190 + (long)pcVar9);
    if (lStack_1a8 != 1) goto LAB_001cf12d;
    pcVar9 = pcVar9 + 0x10;
    lStack_1a8 = 1;
    if (pcVar9 == (code *)0x80) {
      return 0;
    }
  }
  goto LAB_001cf13a;
LAB_001cf12d:
  pcStack_1b0 = (code *)0x1cf13a;
  run_test_threadpool_multiple_event_loops_cold_3();
LAB_001cf13a:
  puVar10 = &uStack_1a0;
  pcStack_1b0 = do_work;
  run_test_threadpool_multiple_event_loops_cold_2();
  puStack_f48 = (uv_loop_t *)0x1cf166;
  pcStack_1c0 = pcVar9;
  lStack_1b8 = lVar15;
  pcStack_1b0 = (code *)unaff_R15;
  iVar4 = uv_loop_init(&uStack_c48);
  afStack_920[0].thread_id = (uv_thread_t)iVar4;
  agStack_f30[0].thread_id = 0;
  if (afStack_920[0].thread_id == 0) {
    lVar15 = 0;
    do {
      *(undefined4 *)((long)agStack_f30[0].handle.reserved + lVar15 + -0x28) = 4;
      *(uv_loop_t **)((long)agStack_f30[0].handle.reserved + lVar15 + -0x20) = &uStack_c48;
      puStack_f48 = (uv_loop_t *)0x1cf1a7;
      getaddrinfo_do((getaddrinfo_req *)((long)agStack_f30[0].handle.reserved + lVar15 + -0x30));
      lVar15 = lVar15 + 0xb8;
    } while (lVar15 != 0x2e0);
    lVar15 = 0;
    do {
      *(undefined4 *)((long)afStack_920[0].handle.reserved + lVar15 + -0x28) = 4;
      *(uv_loop_t **)((long)afStack_920[0].handle.reserved + lVar15 + -0x20) = &uStack_c48;
      puStack_f48 = (uv_loop_t *)0x1cf1d5;
      fs_do((fs_req *)((long)afStack_920[0].handle.reserved + lVar15 + -0x30));
      lVar15 = lVar15 + 0x1d8;
    } while (lVar15 != 0x760);
    puStack_f48 = (uv_loop_t *)0x1cf1f4;
    iVar4 = uv_run(&uStack_c48,UV_RUN_DEFAULT);
    p_Stack_f38 = (_func_void_uv__work_ptr_int *)(long)iVar4;
    p_Stack_f40 = (_func_void_uv__work_ptr *)0x0;
    if (p_Stack_f38 != (_func_void_uv__work_ptr_int *)0x0) goto LAB_001cf25b;
    puStack_f48 = (uv_loop_t *)0x1cf21b;
    iVar4 = uv_loop_close(&uStack_c48);
    p_Stack_f38 = (_func_void_uv__work_ptr_int *)(long)iVar4;
    p_Stack_f40 = (_func_void_uv__work_ptr *)0x0;
    if (p_Stack_f38 == (_func_void_uv__work_ptr_int *)0x0) {
      *(undefined4 *)(puVar10 + 1) = 1;
      return iVar4;
    }
  }
  else {
    puStack_f48 = (uv_loop_t *)0x1cf25b;
    do_work_cold_1();
LAB_001cf25b:
    puStack_f48 = (uv_loop_t *)0x1cf268;
    do_work_cold_2();
  }
  puStack_f48 = (uv_loop_t *)run_test_thread_local_storage;
  do_work_cold_3();
  uStack_f6c = 0;
  uStack_f70 = 0x6e69616d;
  pcStack_f90 = (code *)0x1cf295;
  puStack_f50 = puVar10;
  puStack_f48 = &uStack_c48;
  iVar4 = uv_key_create(&tls_key);
  uStack_f68 = (uv_thread_t)iVar4;
  alStack_f80[0] = 0;
  if (uStack_f68 == 0) {
    pcStack_f90 = (code *)0x1cf2c1;
    pvVar6 = uv_key_get(&tls_key);
    if (pvVar6 == (void *)0x0) {
      puVar10 = (uv_thread_t *)&uStack_f70;
      pcStack_f90 = (code *)0x1cf2e1;
      uv_key_set(&tls_key,puVar10);
      pcStack_f90 = (code *)0x1cf2e9;
      pcStack_f90 = (code *)uv_key_get(&tls_key);
      if ((code *)puVar10 != pcStack_f90) goto LAB_001cf3dc;
      pcStack_f90 = (code *)0x1cf306;
      iVar4 = uv_thread_create(&uStack_f68,tls_thread,&uStack_f68);
      alStack_f80[0] = (long)iVar4;
      alStack_f80[1]._0_4_ = 0;
      alStack_f80[1]._4_4_ = 0;
      if (alStack_f80[0] == 0) {
        puVar10 = auStack_f60;
        pcStack_f90 = (code *)0x1cf33d;
        iVar4 = uv_thread_create(puVar10,tls_thread,puVar10);
        alStack_f80[0] = (long)iVar4;
        alStack_f80[1]._0_4_ = 0;
        alStack_f80[1]._4_4_ = 0;
        if (alStack_f80[0] != 0) goto LAB_001cf437;
        pcStack_f90 = (code *)0x1cf367;
        iVar4 = uv_thread_join(&uStack_f68);
        alStack_f80[0] = (long)iVar4;
        alStack_f80[1]._0_4_ = 0;
        alStack_f80[1]._4_4_ = 0;
        if (alStack_f80[0] != 0) goto LAB_001cf446;
        pcStack_f90 = (code *)0x1cf38f;
        iVar4 = uv_thread_join(puVar10);
        alStack_f80[0] = (long)iVar4;
        alStack_f80[1]._0_4_ = 0;
        alStack_f80[1]._4_4_ = 0;
        if (alStack_f80[0] == 0) {
          pcStack_f90 = (code *)0x1cf3bb;
          uv_key_delete(&tls_key);
          return 0;
        }
      }
      else {
        pcStack_f90 = (code *)0x1cf437;
        run_test_thread_local_storage_cold_3();
LAB_001cf437:
        pcStack_f90 = (code *)0x1cf446;
        run_test_thread_local_storage_cold_4();
LAB_001cf446:
        pcStack_f90 = (code *)0x1cf455;
        run_test_thread_local_storage_cold_5();
      }
      plVar13 = alStack_f80;
      pcStack_f90 = tls_thread;
      run_test_thread_local_storage_cold_6();
      pcStack_f90 = (code *)&tls_key;
      uStack_fa8 = 0x1cf477;
      puStack_f98 = puVar10;
      pvVar6 = uv_key_get(&tls_key);
      if (pvVar6 != (void *)0x0) {
        uStack_fa8 = 0x1cf4c9;
        tls_thread_cold_1();
        uStack_fa8 = (uv_thread_t)extraout_RAX_00;
LAB_001cf4c9:
        auStack_fb0 = (undefined1  [8])0x1f52c5;
        pcStack_fc0 = (code *)0x209468;
        pStack_ff8._48_8_ = 0x1cf50c;
        plStack_fb8 = plVar13;
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
                ,0xc3,"arg");
        uStack_fa8 = 0x1cf515;
        abort();
      }
      uStack_fa8 = 0x1cf48e;
      uv_key_set(&tls_key,plVar13);
      uStack_fa8 = 0x1cf496;
      uStack_fa8 = (uv_thread_t)uv_key_get(&tls_key);
      if ((long *)uStack_fa8 != plVar13) goto LAB_001cf4c9;
      uStack_fa8 = 0x1cf4ac;
      uv_key_set(&tls_key,(void *)0x0);
      uStack_fa8 = 0x1cf4b4;
      pvVar6 = uv_key_get(&tls_key);
      if (pvVar6 == (void *)0x0) {
        return 0;
      }
      uStack_fa8 = (uv_thread_t)run_test_thread_stack_size;
      tls_thread_cold_2();
      pcStack_fc0 = (code *)0x1cf534;
      iVar4 = uv_thread_create(&uStack_fa8,thread_check_stack,(void *)0x0);
      auStack_fb0 = (undefined1  [8])(long)iVar4;
      plStack_fb8 = (long *)0x0;
      if (auStack_fb0 == (undefined1  [8])0x0) {
        pcStack_fc0 = (code *)0x1cf558;
        iVar4 = uv_thread_join(&uStack_fa8);
        auStack_fb0 = (undefined1  [8])(long)iVar4;
        plStack_fb8 = (long *)0x0;
        if (auStack_fb0 == (undefined1  [8])0x0) {
          return 0;
        }
      }
      else {
        pcStack_fc0 = (code *)0x1cf586;
        run_test_thread_stack_size_cold_1();
      }
      puVar11 = (uv_loop_t *)auStack_fb0;
      pcStack_fc0 = thread_check_stack;
      run_test_thread_stack_size_cold_2();
      pcStack_fc0 = (code *)&tls_key;
      puStack_1028 = (uv_loop_t *)0x1cf5aa;
      iVar4 = getrlimit64(RLIMIT_STACK,&rStack_1008);
      pStack_ff8.__align = (long)iVar4;
      sStack_1010 = 0;
      if (pStack_ff8.__align == 0) {
        if (rStack_1008.rlim_cur == 0xffffffffffffffff) {
          rStack_1008.rlim_cur = 0x200000;
        }
        puStack_1028 = (uv_loop_t *)0x1cf5e0;
        __th = pthread_self();
        puStack_1028 = (uv_loop_t *)0x1cf5ed;
        iVar4 = pthread_getattr_np(__th,&pStack_ff8);
        sStack_1010 = (size_t)iVar4;
        sStack_1020 = 0;
        if (sStack_1010 != 0) goto LAB_001cf699;
        puStack_1028 = (uv_loop_t *)0x1cf61a;
        iVar4 = pthread_attr_getstacksize(&pStack_ff8,&sStack_1010);
        sStack_1020 = (size_t)iVar4;
        rStack_1018 = 0;
        if (sStack_1020 != 0) goto LAB_001cf6a6;
        if ((puVar11 == (uv_loop_t *)0x0) ||
           (rStack_1018 = *(rlim64_t *)&puVar11->active_handles,
           *(rlim64_t *)&puVar11->active_handles == 0)) {
          rStack_1018 = rStack_1008.rlim_cur;
        }
        sStack_1020 = sStack_1010;
        if ((long)sStack_1010 < (long)rStack_1018) goto LAB_001cf6b3;
        puStack_1028 = (uv_loop_t *)0x1cf66a;
        iVar4 = pthread_attr_destroy(&pStack_ff8);
        sStack_1020 = (size_t)iVar4;
        rStack_1018 = 0;
        if (sStack_1020 == 0) {
          return iVar4;
        }
      }
      else {
        puStack_1028 = (uv_loop_t *)0x1cf699;
        thread_check_stack_cold_1();
LAB_001cf699:
        puStack_1028 = (uv_loop_t *)0x1cf6a6;
        thread_check_stack_cold_2();
LAB_001cf6a6:
        puStack_1028 = (uv_loop_t *)0x1cf6b3;
        thread_check_stack_cold_3();
LAB_001cf6b3:
        puStack_1028 = (uv_loop_t *)0x1cf6c0;
        thread_check_stack_cold_5();
      }
      puStack_1028 = (uv_loop_t *)run_test_thread_stack_size_explicit;
      thread_check_stack_cold_4();
      auStack_1098._96_4_ = 1;
      pEStack_1030 = &Elf64_Ehdr_00100000;
      auStack_1098._56_8_ = (void *)0x1cf6f9;
      puStack_1028 = puVar11;
      iVar4 = uv_thread_create_ex((uv_thread_t *)(auStack_1098 + 0x58),
                                  (uv_thread_options_t *)(auStack_1098 + 0x60),thread_check_stack,
                                  (uv_thread_options_t *)(auStack_1098 + 0x60));
      auStack_1098._80_8_ = SEXT48(iVar4);
      auStack_1098._72_8_ = 0;
      if ((uv_fs_cb)auStack_1098._80_8_ == (uv_fs_cb)0x0) {
        auStack_1098._56_8_ = (void *)0x1cf723;
        iVar4 = uv_thread_join((uv_thread_t *)(auStack_1098 + 0x58));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf9f7;
        pEStack_1030 = (Elf64_Ehdr *)(data + 0x4441a0);
        auStack_1098._56_8_ = (void *)0x1cf764;
        iVar4 = uv_thread_create_ex((uv_thread_t *)(auStack_1098 + 0x58),
                                    (uv_thread_options_t *)(auStack_1098 + 0x60),thread_check_stack,
                                    (uv_thread_options_t *)(auStack_1098 + 0x60));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa06;
        auStack_1098._56_8_ = (void *)0x1cf78e;
        iVar4 = uv_thread_join((uv_thread_t *)(auStack_1098 + 0x58));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa15;
        puVar11 = (uv_loop_t *)0x0;
        pEStack_1030 = (Elf64_Ehdr *)0x0;
        auStack_1098._56_8_ = (void *)0x1cf7cd;
        iVar4 = uv_thread_create_ex((uv_thread_t *)(auStack_1098 + 0x58),
                                    (uv_thread_options_t *)(auStack_1098 + 0x60),thread_check_stack,
                                    (uv_thread_options_t *)(auStack_1098 + 0x60));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa24;
        auStack_1098._56_8_ = (void *)0x1cf7f3;
        iVar4 = uv_thread_join((uv_thread_t *)(auStack_1098 + 0x58));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa33;
        pEStack_1030 = (Elf64_Ehdr *)0x2a;
        auStack_1098._56_8_ = (void *)0x1cf834;
        iVar4 = uv_thread_create_ex((uv_thread_t *)(auStack_1098 + 0x58),
                                    (uv_thread_options_t *)(auStack_1098 + 0x60),thread_check_stack,
                                    (uv_thread_options_t *)(auStack_1098 + 0x60));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa42;
        auStack_1098._56_8_ = (void *)0x1cf85e;
        iVar4 = uv_thread_join((uv_thread_t *)(auStack_1098 + 0x58));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa51;
        auStack_1098._56_8_ = (void *)0x1cf888;
        lVar15 = __sysconf(0x4b);
        pEStack_1030 = (Elf64_Ehdr *)(lVar15 + -0x2a);
        auStack_1098._56_8_ = (void *)0x1cf8a9;
        iVar4 = uv_thread_create_ex((uv_thread_t *)(auStack_1098 + 0x58),
                                    (uv_thread_options_t *)(auStack_1098 + 0x60),thread_check_stack,
                                    (uv_thread_options_t *)(auStack_1098 + 0x60));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa60;
        auStack_1098._56_8_ = (void *)0x1cf8d3;
        iVar4 = uv_thread_join((uv_thread_t *)(auStack_1098 + 0x58));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa6f;
        auStack_1098._56_8_ = (void *)0x1cf8fd;
        lVar15 = __sysconf(0x4b);
        pEStack_1030 = (Elf64_Ehdr *)(lVar15 / 2 + -0x2a);
        auStack_1098._56_8_ = (void *)0x1cf92b;
        iVar4 = uv_thread_create_ex((uv_thread_t *)(auStack_1098 + 0x58),
                                    (uv_thread_options_t *)(auStack_1098 + 0x60),thread_check_stack,
                                    (uv_thread_options_t *)(auStack_1098 + 0x60));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa7e;
        auStack_1098._56_8_ = (void *)0x1cf955;
        iVar4 = uv_thread_join((uv_thread_t *)(auStack_1098 + 0x58));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa8d;
        pEStack_1030 = (Elf64_Ehdr *)0x12d687;
        auStack_1098._56_8_ = (void *)0x1cf996;
        iVar4 = uv_thread_create_ex((uv_thread_t *)(auStack_1098 + 0x58),
                                    (uv_thread_options_t *)(auStack_1098 + 0x60),thread_check_stack,
                                    (uv_thread_options_t *)(auStack_1098 + 0x60));
        auStack_1098._80_8_ = SEXT48(iVar4);
        auStack_1098._72_8_ = 0;
        if ((uv_fs_cb)auStack_1098._80_8_ == (uv_fs_cb)0x0) {
          auStack_1098._56_8_ = (void *)0x1cf9c0;
          iVar4 = uv_thread_join((uv_thread_t *)(auStack_1098 + 0x58));
          auStack_1098._80_8_ = SEXT48(iVar4);
          auStack_1098._72_8_ = 0;
          if ((uv_fs_cb)auStack_1098._80_8_ == (uv_fs_cb)0x0) {
            return 0;
          }
          goto LAB_001cfaab;
        }
      }
      else {
        auStack_1098._56_8_ = (void *)0x1cf9f7;
        run_test_thread_stack_size_explicit_cold_1();
LAB_001cf9f7:
        auStack_1098._56_8_ = (void *)0x1cfa06;
        run_test_thread_stack_size_explicit_cold_2();
LAB_001cfa06:
        auStack_1098._56_8_ = (void *)0x1cfa15;
        run_test_thread_stack_size_explicit_cold_3();
LAB_001cfa15:
        auStack_1098._56_8_ = (void *)0x1cfa24;
        run_test_thread_stack_size_explicit_cold_4();
LAB_001cfa24:
        auStack_1098._56_8_ = (void *)0x1cfa33;
        run_test_thread_stack_size_explicit_cold_5();
LAB_001cfa33:
        auStack_1098._56_8_ = (void *)0x1cfa42;
        run_test_thread_stack_size_explicit_cold_6();
LAB_001cfa42:
        auStack_1098._56_8_ = (void *)0x1cfa51;
        run_test_thread_stack_size_explicit_cold_7();
LAB_001cfa51:
        auStack_1098._56_8_ = (void *)0x1cfa60;
        run_test_thread_stack_size_explicit_cold_8();
LAB_001cfa60:
        auStack_1098._56_8_ = (void *)0x1cfa6f;
        run_test_thread_stack_size_explicit_cold_9();
LAB_001cfa6f:
        auStack_1098._56_8_ = (void *)0x1cfa7e;
        run_test_thread_stack_size_explicit_cold_10();
LAB_001cfa7e:
        auStack_1098._56_8_ = (void *)0x1cfa8d;
        run_test_thread_stack_size_explicit_cold_11();
LAB_001cfa8d:
        auStack_1098._56_8_ = (void *)0x1cfa9c;
        run_test_thread_stack_size_explicit_cold_12();
      }
      auStack_1098._56_8_ = (void *)0x1cfaab;
      run_test_thread_stack_size_explicit_cold_13();
LAB_001cfaab:
      puVar14 = auStack_1098 + 0x50;
      auStack_1098._56_8_ = getaddrinfo_do;
      run_test_thread_stack_size_explicit_cold_14();
      auStack_1098._32_8_ = (void *)0x1cfae2;
      iVar4 = uv_getaddrinfo(*(uv_loop_t **)(puVar14 + 0x10),(uv_getaddrinfo_t *)(puVar14 + 0x18),
                             getaddrinfo_cb,"localhost",(char *)0x0,(addrinfo *)0x0);
      auStack_1098._56_8_ = SEXT48(iVar4);
      auStack_1098._48_8_ = (void *)0x0;
      if ((void *)auStack_1098._56_8_ == (void *)0x0) {
        return iVar4;
      }
      puVar14 = auStack_1098 + 0x38;
      auStack_1098._32_8_ = fs_do;
      getaddrinfo_do_cold_1();
      auStack_1098._8_8_ = (uv_loop_t *)0x1cfb34;
      iVar4 = uv_fs_stat(*(uv_loop_t **)(puVar14 + 0x10),(uv_fs_t *)(puVar14 + 0x18),".",fs_cb);
      auStack_1098._32_8_ = SEXT48(iVar4);
      auStack_1098._24_8_ = (void *)0x0;
      if ((void *)auStack_1098._32_8_ == (void *)0x0) {
        return iVar4;
      }
      puVar14 = auStack_1098 + 0x20;
      iVar4 = (int)auStack_1098 + 0x18;
      auStack_1098._8_8_ = getaddrinfo_cb;
      fs_do_cold_1();
      auStack_1098._0_8_ = SEXT48(iVar4);
      auStack_1098._8_8_ = puVar11;
      if ((void *)auStack_1098._0_8_ != (void *)0x0) {
        req = (uv_fs_t *)auStack_1098;
        getaddrinfo_cb_cold_1();
        uv_fs_req_cleanup(req);
        puVar2 = req[-1].bufsml + 3;
        *(int *)&puVar2->base = *(int *)&puVar2->base + -1;
        if (*(int *)&puVar2->base != 0) {
          fs_do((fs_req *)&req[-1].bufsml[2].len);
          return extraout_EAX_03;
        }
        return extraout_EAX_02;
      }
      uv_freeaddrinfo(ai);
      piVar1 = (int *)(puVar14 + -0x10);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 != 0) {
        getaddrinfo_do((getaddrinfo_req *)(puVar14 + -0x18));
        return extraout_EAX_01;
      }
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_f90 = (code *)0x1cf3d4;
    run_test_thread_local_storage_cold_1();
  }
  pcStack_f90 = (code *)0x1cf3dc;
  run_test_thread_local_storage_cold_2();
  pcStack_f90 = (code *)extraout_RAX;
LAB_001cf3dc:
  puStack_f98 = (uv_thread_t *)0x1f52c5;
  uStack_fa8 = 0x209468;
  auStack_fb0 = (undefined1  [8])0x1cf41f;
  puStack_fa0 = puVar10;
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
          ,0xcf,"name");
  pcStack_f90 = (code *)0x1cf428;
  abort();
}

Assistant:

TEST_IMPL(thread_affinity) {
  int t1first;
  int t1second;
  int t2first;
  int t2second;
  int cpumasksize;
  char* cpumask;
  int ncpus;
  int r;
  int c;
  int i;
  uv_thread_t threads[3];

#ifdef _WIN32
  /* uv_thread_self isn't defined for the main thread on Windows */
  threads[0] = GetCurrentThread();
#else
  threads[0] = uv_thread_self();
#endif
  cpumasksize = uv_cpumask_size();
  ASSERT_GT(cpumasksize, 0);

  cpumask = calloc(4 * cpumasksize, 1);
  ASSERT(cpumask);

  r = uv_thread_getaffinity(&threads[0], cpumask, cpumasksize);
  ASSERT_OK(r);
  ASSERT(cpumask[0] && "test must be run with cpu 0 affinity");
  ncpus = 0;
  while (cpumask[++ncpus]) { }
  memset(cpumask, 0, 4 * cpumasksize);

  t1first = cpumasksize * 0;
  t1second = cpumasksize * 1;
  t2first = cpumasksize * 2;
  t2second = cpumasksize * 3;

  cpumask[t1second + 0] = 1;
  cpumask[t2first + 0] = 1;
  cpumask[t1first + (ncpus >= 2)] = 1;
  cpumask[t2second + (ncpus >= 2)] = 1;
#ifdef __linux__
  cpumask[t1second + 2] = 1;
  cpumask[t2first + 2] = 1;
  cpumask[t1first + 3] = 1;
  cpumask[t2second + 3] = 1;
#else
  if (ncpus >= 3) {
    cpumask[t1second + 2] = 1;
    cpumask[t2first + 2] = 1;
  }
  if (ncpus >= 4) {
    cpumask[t1first + 3] = 1;
    cpumask[t2second + 3] = 1;
  }
#endif

  ASSERT_OK(uv_thread_create(threads + 1,
                             check_affinity,
                             &cpumask[t1first]));
  ASSERT_OK(uv_thread_create(threads + 2,
                             check_affinity,
                             &cpumask[t2first]));
  ASSERT_OK(uv_thread_join(threads + 1));
  ASSERT_OK(uv_thread_join(threads + 2));

  ASSERT(cpumask[t1first + 0] == (ncpus == 1));
  ASSERT(cpumask[t1first + 1] == (ncpus >= 2));
  ASSERT_OK(cpumask[t1first + 2]);
  ASSERT(cpumask[t1first + 3] == (ncpus >= 4));

  ASSERT_EQ(1, cpumask[t2first + 0]);
  ASSERT_OK(cpumask[t2first + 1]);
  ASSERT(cpumask[t2first + 2] == (ncpus >= 3));
  ASSERT_OK(cpumask[t2first + 3]);

  c = uv_thread_getcpu();
  ASSERT_GE(c, 0);

  memset(cpumask, 0, cpumasksize);
  cpumask[c] = 1;
  r = uv_thread_setaffinity(&threads[0], cpumask, NULL, cpumasksize);
  ASSERT_OK(r);

  memset(cpumask, 0, cpumasksize);
  r = uv_thread_getaffinity(&threads[0], cpumask, cpumasksize);
  ASSERT_OK(r);
  for (i = 0; i < cpumasksize; i++) {
    if (i == c)
      ASSERT_EQ(1, cpumask[i]);
    else
      ASSERT_OK(cpumask[i]);
  }

  free(cpumask);

  return 0;
}